

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O2

void __thiscall GEN_Register::setReg_8(GEN_Register *this,string *flagName,uint8_t value)

{
  bool bVar1;
  bitset<8UL> *pbVar2;
  
  bVar1 = std::operator==(flagName,"AL");
  if (bVar1) {
    pbVar2 = &AL;
  }
  else {
    bVar1 = std::operator==(flagName,"AH");
    if (bVar1) {
      pbVar2 = &AH;
    }
    else {
      bVar1 = std::operator==(flagName,"DL");
      if (bVar1) {
        pbVar2 = &DL;
      }
      else {
        bVar1 = std::operator==(flagName,"DH");
        if (bVar1) {
          pbVar2 = &DH;
        }
        else {
          bVar1 = std::operator==(flagName,"CL");
          if (bVar1) {
            pbVar2 = &CL;
          }
          else {
            bVar1 = std::operator==(flagName,"CH");
            if (bVar1) {
              pbVar2 = &CH;
            }
            else {
              bVar1 = std::operator==(flagName,"BL");
              if (bVar1) {
                pbVar2 = &BL;
              }
              else {
                bVar1 = std::operator==(flagName,"BH");
                if (!bVar1) {
                  return;
                }
                pbVar2 = &BH;
              }
            }
          }
        }
      }
    }
  }
  (pbVar2->super__Base_bitset<1UL>)._M_w = (ulong)value;
  return;
}

Assistant:

void GEN_Register::setReg_8(std::string flagName, uint8_t value)
{
	if (flagName == "AL")
	{
		AL = std::bitset<8>(value);
	} else if (flagName == "AH")
	{
		AH = std::bitset<8>(value);
	}
    else if (flagName == "DL")
    {
        DL = std::bitset<8>(value);
    } else if (flagName == "DH")
    {
        DH = std::bitset<8>(value);
    }
    else if (flagName == "CL")
    {
        CL = std::bitset<8>(value);
    } else if (flagName == "CH")
    {
        CH = std::bitset<8>(value);
    }
    else if (flagName == "BL")
    {
        BL = std::bitset<8>(value);
    } else if (flagName == "BH")
    {
        BH = std::bitset<8>(value);
    }
}